

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hh
# Opt level: O0

void __thiscall hgdb::json::SymbolTable::VarAssign::handle(VarAssign *this,VarStmt *s)

{
  bool bVar1;
  char *pcVar2;
  mapped_type *__rhs;
  int in_EDX;
  _Node_iterator_base<std::pair<const_hgdb::json::Variable,_unsigned_long>,_true> local_30;
  _Node_iterator_base<std::pair<const_hgdb::json::Variable,_unsigned_long>,_true> local_28;
  variant_alternative_t<0UL,_variant<Variable,_unsigned_long>_> *local_20;
  variant_alternative_t<0UL,_variant<Variable,_unsigned_long>_> *var;
  VarStmt *s_local;
  VarAssign *this_local;
  
  var = (variant_alternative_t<0UL,_variant<Variable,_unsigned_long>_> *)s;
  s_local = (VarStmt *)this;
  pcVar2 = std::variant<hgdb::json::Variable,_unsigned_long>::index(&s->var_,(char *)s,in_EDX);
  if (pcVar2 == (char *)0x0) {
    local_20 = std::get<0ul,hgdb::json::Variable,unsigned_long>
                         ((variant<hgdb::json::Variable,_unsigned_long> *)
                          &var[1].value._M_string_length);
    local_28._M_cur =
         (__node_type *)
         std::
         unordered_map<hgdb::json::Variable,_unsigned_long,_hgdb::json::Variable::hash_fn,_std::equal_to<hgdb::json::Variable>,_std::allocator<std::pair<const_hgdb::json::Variable,_unsigned_long>_>_>
         ::find(this->id_,local_20);
    local_30._M_cur =
         (__node_type *)
         std::
         unordered_map<hgdb::json::Variable,_unsigned_long,_hgdb::json::Variable::hash_fn,_std::equal_to<hgdb::json::Variable>,_std::allocator<std::pair<const_hgdb::json::Variable,_unsigned_long>_>_>
         ::end(this->id_);
    bVar1 = std::__detail::operator!=(&local_28,&local_30);
    if (bVar1) {
      __rhs = std::
              unordered_map<hgdb::json::Variable,_unsigned_long,_hgdb::json::Variable::hash_fn,_std::equal_to<hgdb::json::Variable>,_std::allocator<std::pair<const_hgdb::json::Variable,_unsigned_long>_>_>
              ::at(this->id_,local_20);
      std::variant<hgdb::json::Variable,unsigned_long>::operator=
                ((variant<hgdb::json::Variable,unsigned_long> *)&var[1].value._M_string_length,__rhs
                );
    }
  }
  return;
}

Assistant:

void handle(VarStmt *s) override {
            if (s->var_.index() == 0) {
                auto const &var = std::get<0>(s->var_);
                if (id_.find(var) != id_.end()) {
                    s->var_ = id_.at(var);
                }
            }
        }